

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner.hpp
# Opt level: O3

bool __thiscall
ot::commissioner::CommissionerHandler::OnJoinerFinalize
          (CommissionerHandler *this,ByteArray *aJoinerId,string *aVendorName,string *aVendorModel,
          string *aVendorSwVersion,ByteArray *aVendorStackVersion,string *aProvisioningUrl,
          ByteArray *aVendorData)

{
  return false;
}

Assistant:

virtual bool OnJoinerFinalize(const ByteArray   &aJoinerId,
                                  const std::string &aVendorName,
                                  const std::string &aVendorModel,
                                  const std::string &aVendorSwVersion,
                                  const ByteArray   &aVendorStackVersion,
                                  const std::string &aProvisioningUrl,
                                  const ByteArray   &aVendorData)
    {
        (void)aJoinerId;
        (void)aVendorName;
        (void)aVendorModel;
        (void)aVendorSwVersion;
        (void)aVendorStackVersion;
        (void)aProvisioningUrl;
        (void)aVendorData;
        return false;
    }